

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

ThreadLog * __thiscall deqp::egl::ThreadLog::operator<<(ThreadLog *this,EndMessageToken *param_1)

{
  deUint64 timeUs_;
  char *msg_;
  allocator<char> local_91;
  string local_90 [48];
  string local_60 [32];
  Message local_40;
  EndMessageToken *local_18;
  EndMessageToken *param_1_local;
  ThreadLog *this_local;
  
  local_18 = param_1;
  param_1_local = (EndMessageToken *)this;
  timeUs_ = deGetMicroseconds();
  std::__cxx11::ostringstream::str();
  msg_ = (char *)std::__cxx11::string::c_str();
  Message::Message(&local_40,timeUs_,msg_);
  std::vector<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>::
  push_back(&this->m_messages,&local_40);
  Message::~Message(&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"",&local_91);
  std::__cxx11::ostringstream::str((string *)this);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  return this;
}

Assistant:

ThreadLog& ThreadLog::operator<< (const EndMessageToken&)
{
	m_messages.push_back(Message(deGetMicroseconds(), m_message.str().c_str()));
	m_message.str("");
	return *this;
}